

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectStoreToken.cpp
# Opt level: O1

bool ObjectStoreToken::selectBackend(string *backend)

{
  int iVar1;
  
  iVar1 = std::__cxx11::string::compare((char *)backend);
  if (iVar1 != 0) {
    softHSMLog(3,"selectBackend",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectStoreToken.cpp"
               ,0x44,"Unknown value (%s) for objectstore.backend in configuration",
               (backend->_M_dataplus)._M_p);
  }
  return iVar1 == 0;
}

Assistant:

bool ObjectStoreToken::selectBackend(const std::string &backend)
{
	if (backend == "file")
	{
		static_createToken = reinterpret_cast<CreateToken>(OSToken::createToken);
		static_accessToken = reinterpret_cast<AccessToken>(OSToken::accessToken);
	}
#ifdef HAVE_OBJECTSTORE_BACKEND_DB
	else if (backend == "db")
	{
		static_createToken = reinterpret_cast<CreateToken>(DBToken::createToken);
		static_accessToken = reinterpret_cast<AccessToken>(DBToken::accessToken);
	}
#endif
	else
	{
		ERROR_MSG("Unknown value (%s) for objectstore.backend in configuration", backend.c_str());
		return false;
	}